

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

EnumSchema __thiscall capnp::Schema::asEnum(Schema *this)

{
  Schema SVar1;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if ((local_40._reader.dataSize < 0x70) || (*(short *)((long)local_40._reader.data + 0xc) != 2)) {
    getProto(&local_40,this);
    local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x115,FAILED,"getProto().isEnum()",
               "\"Tried to use non-enum schema as an enum.\", getProto().getDisplayName()",
               (char (*) [41])"Tried to use non-enum schema as an enum.",(Reader *)&local_50);
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(capnp::_::NULL_ENUM_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (EnumSchema)SVar1.raw;
}

Assistant:

EnumSchema Schema::asEnum() const {
  KJ_REQUIRE(getProto().isEnum(), "Tried to use non-enum schema as an enum.",
             getProto().getDisplayName()) {
    return EnumSchema();
  }
  return EnumSchema(*this);
}